

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

unsigned_long_long ZSTD_XXH64_digest(XXH64_state_t *state_in)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long_long *puVar6;
  uint *puVar7;
  
  if (state_in->total_len < 0x20) {
    lVar4 = state_in->v3 + 0x27d4eb2f165667c5;
  }
  else {
    uVar1 = state_in->v1;
    uVar5 = state_in->v2;
    uVar2 = state_in->v3;
    uVar3 = state_in->v4;
    lVar4 = ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar5 * -0x6c158a5880000000 | uVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar1 * -0x6c158a5880000000 | uVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar3 << 0x12 | uVar3 >> 0x2e) + (uVar2 << 0xc | uVar2 >> 0x34) +
            (uVar5 << 7 | uVar5 >> 0x39) + (uVar1 << 1 | (ulong)((long)uVar1 < 0))) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  puVar7 = (uint *)((long)state_in->mem64 + (ulong)state_in->memsize);
  uVar5 = lVar4 + state_in->total_len;
  puVar6 = state_in->mem64;
  while (puVar6 + 1 <= puVar7) {
    uVar5 = (*puVar6 * -0x6c158a5880000000 | *puVar6 * -0x3d4d51c2d82b14b1 >> 0x21) *
            -0x61c8864e7a143579 ^ uVar5;
    uVar5 = (uVar5 << 0x1b | uVar5 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
    puVar6 = puVar6 + 1;
  }
  if ((unsigned_long_long *)((long)puVar6 + 4U) <= puVar7) {
    uVar5 = (ulong)(uint)*puVar6 * -0x61c8864e7a143579 ^ uVar5;
    uVar5 = (uVar5 << 0x17 | uVar5 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    puVar6 = (unsigned_long_long *)((long)puVar6 + 4U);
  }
  for (; puVar6 < puVar7; puVar6 = (unsigned_long_long *)((long)puVar6 + 1)) {
    uVar5 = (ulong)(byte)*puVar6 * 0x27d4eb2f165667c5 ^ uVar5;
    uVar5 = (uVar5 << 0xb | uVar5 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3d4d51c2d82b14b1;
  uVar5 = (uVar5 >> 0x1d ^ uVar5) * 0x165667b19e3779f9;
  return uVar5 >> 0x20 ^ uVar5;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64_digest (const XXH64_state_t* state_in)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}